

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWriteYUV(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint8_t *puVar9;
  
  uVar7 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    iVar1 = buffer->width;
    iVar2 = buffer->height;
    puVar9 = (buffer->u).RGBA.rgba;
    __ptr_00 = (buffer->u).YUVA.u;
    __ptr = (buffer->u).YUVA.v;
    iVar4 = (iVar2 + 1) / 2;
    uVar7 = 0;
    if (__ptr != (uint8_t *)0x0 && (__ptr_00 != (uint8_t *)0x0 && puVar9 != (uint8_t *)0x0)) {
      puVar3 = (buffer->u).YUVA.a;
      uVar7 = 1;
      for (iVar8 = 0; (uVar7 != 0 && (iVar8 < iVar2)); iVar8 = iVar8 + 1) {
        sVar5 = fwrite(puVar9,(long)iVar1,1,(FILE *)fout);
        uVar7 = (uint)(sVar5 == 1);
        puVar9 = puVar9 + (buffer->u).YUVA.y_stride;
      }
      sVar5 = (size_t)((iVar1 + 1) / 2);
      for (iVar8 = 0; (uVar7 != 0 && (iVar8 < iVar4)); iVar8 = iVar8 + 1) {
        sVar6 = fwrite(__ptr_00,sVar5,1,(FILE *)fout);
        uVar7 = (uint)(sVar6 == 1);
        __ptr_00 = __ptr_00 + (buffer->u).YUVA.u_stride;
      }
      for (iVar8 = 0; (uVar7 != 0 && (iVar8 < iVar4)); iVar8 = iVar8 + 1) {
        sVar6 = fwrite(__ptr,sVar5,1,(FILE *)fout);
        uVar7 = (uint)(sVar6 == 1);
        __ptr = __ptr + (buffer->u).YUVA.v_stride;
      }
      puVar9 = puVar3;
      for (iVar4 = 0; ((uVar7 != 0 && (puVar3 != (uint8_t *)0x0)) && (iVar4 < iVar2));
          iVar4 = iVar4 + 1) {
        sVar5 = fwrite(puVar9,(long)iVar1,1,(FILE *)fout);
        uVar7 = (uint)(sVar5 == 1);
        puVar9 = puVar9 + (buffer->u).YUVA.a_stride;
      }
    }
  }
  return uVar7;
}

Assistant:

int WebPWriteYUV(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      src_a += yuv->a_stride;
    }
    return ok;
  }
}